

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.cpp
# Opt level: O2

MPP_RET __thiscall
RcImplApiService::api_get_by_type
          (RcImplApiService *this,RcApiBrief *brief,RK_S32 *count,RK_S32 max_count,
          MppCodingType type)

{
  list_head *plVar1;
  list_head *plVar2;
  uint uVar3;
  list_head *plVar4;
  ulong uVar5;
  AutoMutex auto_lock;
  Autolock local_38;
  
  local_38.mLock = get_lock();
  local_38.mEnabled = 1;
  if ((pthread_mutex_t *)local_38.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)local_38.mLock);
  }
  uVar3 = 0;
  plVar1 = (this->mApis).next;
  while ((plVar4 = plVar1, plVar4 != &this->mApis && ((int)uVar3 < max_count))) {
    plVar1 = plVar4->next;
    if (*(MppCodingType *)&plVar4[3].next == type) {
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      plVar2 = plVar4[4].next;
      brief[uVar5].name = (char *)plVar4[3].prev;
      *(list_head **)&brief[uVar5].type = plVar2;
    }
  }
  *count = uVar3;
  Mutex::Autolock::~Autolock(&local_38);
  return MPP_OK;
}

Assistant:

MPP_RET RcImplApiService::api_get_by_type(RcApiBrief *brief, RK_S32 *count,
                                          RK_S32 max_count, MppCodingType type)
{
    RK_S32 cnt = 0;
    RcImplApiNode *pos, *n;

    AutoMutex auto_lock(get_lock());

    list_for_each_entry_safe(pos, n, &mApis, RcImplApiNode, list) {
        if (cnt >= max_count)
            break;

        if (pos->type != type)
            continue;

        brief[cnt++] = pos->brief;
    }

    *count = cnt;

    return MPP_OK;
}